

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall gl4cts::DirectStateAccess::Textures::BindUnitTest::Draw(BindUnitTest *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  MessageBuilder *this_01;
  ulong uVar7;
  undefined **ppuVar8;
  GLuint *value;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0x1680))(this->m_po);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glUseProgram call has failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c0f);
  value = this->m_to;
  ppuVar8 = &s_fragment_shader_samplers;
  uVar7 = 0;
  do {
    if (uVar7 == 4) {
      (**(code **)(lVar6 + 0x538))(5,0,4);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glDrawArrays call has failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x1c2b);
LAB_00b336e6:
      return 3 < uVar7;
    }
    (**(code **)(lVar6 + 0xc0))(uVar7 & 0xffffffff,*value);
    local_1c0.m_value = (**(code **)(lVar6 + 0x800))();
    if (local_1c0.m_value != 0) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"BindTextureUnit unexpectedly generated error ");
      local_1c0.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
      std::operator<<((ostream *)this_00," when binding texture ");
      this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
      poVar1 = &this_01->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " to texture unit ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,". Test fails.");
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      goto LAB_00b336e6;
    }
    pcVar2 = *(code **)(lVar6 + 0x14f0);
    uVar5 = (**(code **)(lVar6 + 0xb48))(this->m_po,*ppuVar8);
    (*pcVar2)(uVar5,uVar7 & 0xffffffff);
    dVar4 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar4,"glGetUniformLocation or glUniform1i call has failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x1c26);
    uVar7 = uVar7 + 1;
    value = value + 1;
    ppuVar8 = ppuVar8 + 1;
  } while( true );
}

Assistant:

bool BindUnitTest::Draw()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup program. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call has failed.");

	/* Bind textures to proper units and setup program's samplers. */
	for (glw::GLuint i = 0; i < 4; ++i)
	{
		/* Tested binding funcion. */
		gl.bindTextureUnit(i, m_to[i]);

		/* Check for errors. */
		glw::GLenum error = GL_NO_ERROR;

		if (GL_NO_ERROR != (error = gl.getError()))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "BindTextureUnit unexpectedly generated error " << glu::getErrorStr(error)
				<< " when binding texture " << m_to[i] << " to texture unit " << i << ". Test fails."
				<< tcu::TestLog::EndMessage;

			return false;
		}

		/* Sampler setup. */
		gl.uniform1i(gl.getUniformLocation(m_po, s_fragment_shader_samplers[i]), i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation or glUniform1i call has failed.");
	}

	/* Draw call. */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call has failed.");

	return true;
}